

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_standard_from_disk.unit.cpp
# Opt level: O3

void __thiscall
TestLoadStandardFromDisk_TestLoadNFRC2003_Test::TestBody
          (TestLoadStandardFromDisk_TestLoadNFRC2003_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
  *this_00;
  mapped_type *pmVar2;
  char *pcVar3;
  char *in_R9;
  ScopedTrace gtest_trace_34;
  path nfrc_std_path;
  Optical_Standard_Method photopic;
  Optical_Standard_Method solar;
  Optical_Standard_Method tristim_x;
  Optical_Standard_Method tristim_z;
  Optical_Standard_Method tristim_y;
  Optical_Standard_Method tdw;
  Optical_Standard_Method spf;
  Optical_Standard_Method tkr;
  Optical_Standard nfrc;
  Optical_Standard_Method tuv;
  Optical_Standard_Method thermal_ir;
  undefined1 local_10c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10b8;
  undefined1 local_10a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_10a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1098;
  undefined8 uStack_1090;
  undefined1 local_1088 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1080;
  AssertHelper local_1070;
  undefined1 local_1068 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1060;
  undefined1 local_1058 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1050;
  undefined1 local_1048 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1040;
  undefined1 local_1038 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1030;
  undefined1 local_1028 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1020;
  undefined1 local_1018 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1010;
  undefined1 local_1008 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1000;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_ff8;
  undefined8 uStack_ff0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_fe8;
  undefined8 uStack_fe0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_fd8;
  undefined8 uStack_fd0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_fc8;
  undefined8 uStack_fc0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_fb8;
  undefined8 uStack_fb0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_fa8;
  undefined8 uStack_fa0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f98;
  undefined8 uStack_f90;
  ScopedTrace local_f79;
  undefined1 local_f78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f70;
  undefined1 local_f68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f60;
  undefined1 local_f58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f50;
  undefined1 local_f48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f40;
  undefined1 local_f38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f28;
  undefined8 uStack_f20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f18;
  undefined8 uStack_f10;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f08;
  undefined8 uStack_f00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_ef8;
  undefined8 uStack_ef0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_ee8;
  undefined8 uStack_ee0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_ed8;
  undefined8 uStack_ed0;
  AssertHelper local_ec0;
  AssertHelper local_eb8;
  undefined8 uStack_eb0;
  path local_ea8;
  Optical_Standard_Method local_e80;
  undefined1 local_d20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d10 [3];
  Spectrum_Type local_ce0 [16];
  pair<double,_double> *local_ca0;
  pointer local_c98;
  Spectrum_Type local_c88 [16];
  pointer local_c48;
  pointer local_c40;
  Wavelength_Set_Type local_c30 [10];
  pointer local_c08;
  pointer local_c00;
  Integration_Rule_Type local_bf0 [2];
  double local_be8;
  Wavelength_Boundary_Type local_be0 [2];
  double local_bd8;
  Wavelength_Boundary_Type local_bd0 [2];
  double local_bc8;
  undefined1 local_bc0 [64];
  Spectrum_Type local_b80 [16];
  pair<double,_double> *local_b40;
  pointer local_b38;
  Spectrum_Type local_b28 [16];
  pair<double,_double> *local_ae8;
  pointer local_ae0;
  Wavelength_Set_Type local_ad0 [10];
  double *local_aa8;
  pointer local_aa0;
  Integration_Rule_Type local_a90 [2];
  double local_a88;
  Wavelength_Boundary_Type local_a80 [2];
  double local_a78;
  Wavelength_Boundary_Type local_a70 [2];
  double local_a68;
  Optical_Standard_Method local_a60;
  Optical_Standard_Method local_900;
  Optical_Standard_Method local_7a0;
  Optical_Standard_Method local_640;
  Optical_Standard_Method local_4e0;
  Optical_Standard local_380;
  Optical_Standard_Method local_2f0;
  Optical_Standard_Method local_190;
  
  testing::ScopedTrace::ScopedTrace
            (&local_f79,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
             ,0x22,"Begin Test: Load NFRC 2003 from disk.");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_ea8,&test_dir_abi_cxx11_,auto_format);
  std::filesystem::__cxx11::path::_M_append(&local_ea8,9,"standards");
  std::filesystem::__cxx11::path::_M_append(&local_ea8,0x10,"W5_NFRC_2003.std");
  local_d20 = (undefined1  [8])local_d10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d20,local_ea8._M_pathname._M_dataplus._M_p,
             local_ea8._M_pathname._M_dataplus._M_p + local_ea8._M_pathname._M_string_length);
  window_standards::load_optical_standard(&local_380,(string *)local_d20);
  if (local_d20 != (undefined1  [8])local_d10) {
    operator_delete((void *)local_d20,local_d10[0]._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[52]>
            ((internal *)local_d20,"nfrc.description",
             "\"Consistent with NFRC 300-2003 - default for WINDOW5\"",&local_380.description,
             (char (*) [52])"Consistent with NFRC 300-2003 - default for WINDOW5");
  if (local_d20[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_e80);
    if (local_d18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_bc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_bc0,(Message *)&local_e80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_bc0);
    if ((long *)local_e80.name._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e80.name._M_dataplus._M_p + 8))();
    }
  }
  if (local_d18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d18,local_d18);
  }
  local_e80.name._M_dataplus._M_p =
       (pointer)local_380.methods._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_bc0._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d20,"nfrc.methods.size()","10",(unsigned_long *)&local_e80,
             (int *)local_bc0);
  if (local_d20[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_e80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_e80.name._M_dataplus._M_p + 0x10),"Number of methods loaded",0x18);
    if (local_d18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_bc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x2a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_bc0,(Message *)&local_e80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_bc0);
    if ((long *)local_e80.name._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e80.name._M_dataplus._M_p + 8))();
    }
  }
  if (local_d18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d18,local_d18);
  }
  paVar1 = &local_e80.name.field_2;
  local_e80.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e80,"SOLAR","");
  this_00 = &local_380.methods;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_e80.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_d20,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e80.name._M_dataplus._M_p,local_e80.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_bc0._0_8_ = (AssertHelperData *)(local_bc0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc0,"PHOTOPIC","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,(key_type *)local_bc0);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_e80,pmVar2);
  if ((AssertHelperData *)local_bc0._0_8_ != (AssertHelperData *)(local_bc0 + 0x10)) {
    operator_delete((void *)local_bc0._0_8_,local_bc0._16_8_ + 1);
  }
  paVar1 = &local_900.name.field_2;
  local_900.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"COLOR_TRISTIMX","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_900.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_bc0,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_900.name._M_dataplus._M_p,local_900.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar1 = &local_a60.name.field_2;
  local_a60.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"COLOR_TRISTIMY","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_a60.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_900,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a60.name._M_dataplus._M_p,local_a60.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar1 = &local_190.name.field_2;
  local_190.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"COLOR_TRISTIMZ","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_190.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_a60,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.name._M_dataplus._M_p,local_190.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar1 = &local_2f0.name.field_2;
  local_2f0.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"THERMAL IR","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_2f0.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_190,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f0.name._M_dataplus._M_p,local_2f0.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar1 = &local_640.name.field_2;
  local_640.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"TUV","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_640.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_2f0,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_640.name._M_dataplus._M_p,local_640.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar1 = &local_7a0.name.field_2;
  local_7a0.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"SPF","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_7a0.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_640,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_7a0.name._M_dataplus._M_p,local_7a0.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar1 = &local_4e0.name.field_2;
  local_4e0.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"TDW","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,&local_4e0.name);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_7a0,pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0.name._M_dataplus._M_p,local_4e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_10c8 = (undefined1  [8])&local_10b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10c8,"TKR","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[](this_00,(key_type *)local_10c8);
  window_standards::Optical_Standard_Method::Optical_Standard_Method(&local_4e0,pmVar2);
  if (local_10c8 != (undefined1  [8])&local_10b8) {
    operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)local_10c8,"solar.name","\"SOLAR\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d20,
             (char (*) [6])"SOLAR");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ed8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ed8._M_head_impl + 0x10),"Solar method type",0x11);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_eb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=(&local_eb8,(Message *)&local_ed8);
    testing::internal::AssertHelper::~AssertHelper(&local_eb8);
    if (local_ed8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ed8._M_head_impl + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_ed8._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"solar.source_spectrum.type","Spectrum_Type::FILE",local_ce0,
             (Spectrum_Type *)&local_ed8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ed8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ed8._M_head_impl + 0x10),"Solar source spectrum type",0x1a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_eb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x37,pcVar3);
    testing::internal::AssertHelper::operator=(&local_eb8,(Message *)&local_ed8);
    testing::internal::AssertHelper::~AssertHelper(&local_eb8);
    if (local_ed8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ed8._M_head_impl + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_ed8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_c98 - (long)local_ca0 >> 4);
  local_eb8.data_._0_4_ = 0x79;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"solar.source_spectrum.values.size()","121",
             (unsigned_long *)&local_ed8,(int *)&local_eb8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ed8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ed8._M_head_impl + 0x10),"Solar source spectrum wavelength count",
               0x26);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_eb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_eb8,(Message *)&local_ed8);
    testing::internal::AssertHelper::~AssertHelper(&local_eb8);
    if (local_ed8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ed8._M_head_impl + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_ed8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fd3333333333333;
  uStack_ed0 = 0;
  local_eb8.data_ = (AssertHelperData *)0x40102e147ae147ae;
  uStack_eb0 = 0x401b99999999999a;
  PAIR_NEAR((pair<double,_double> *)local_1028,local_ca0,1e-14);
  if (local_1028[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fe8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fe8._M_head_impl + 0x10),"Solar source spectrum first point",0x21);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1028,
               (AssertionResult *)
               "PAIR_NEAR(solar.source_spectrum.values[0], solar_expected_first_wavelength, 1e-14)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3b,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f38,(Message *)&local_fe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f38);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fe8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fe8._M_head_impl + 8))();
    }
  }
  if (pbStack_1020 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1020,pbStack_1020);
  }
  PAIR_NEAR((pair<double,_double> *)local_1028,local_ca0 + 0x78,1e-14);
  if (local_1028[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fe8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fe8._M_head_impl + 0x10),"Solar source spectrum last point",0x20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1028,
               (AssertionResult *)
               "PAIR_NEAR(solar.source_spectrum.values[120], solar_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3c,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f38,(Message *)&local_fe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f38);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fe8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fe8._M_head_impl + 8))();
    }
  }
  if (pbStack_1020 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1020,pbStack_1020);
  }
  local_1028 = (undefined1  [8])((ulong)(uint)local_1028._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"solar.detector_spectrum.type","Spectrum_Type::NONE",local_c88,
             (Spectrum_Type *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar detector spectrum type",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])((long)local_c40 - (long)local_c48 >> 4);
  local_fe8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_fe8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"solar.detector_spectrum.values.size()","0",
             (unsigned_long *)local_1028,(int *)&local_fe8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar detector spectrum wavelength count",0x28)
    ;
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028._0_4_ = 1;
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"solar.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             local_c30,(Wavelength_Set_Type *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar wavelength set type",0x19);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])((long)local_c00 - (long)local_c08 >> 3);
  local_fe8._M_head_impl = local_fe8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"solar.wavelength_set.values.size()","0",
             (unsigned_long *)local_1028,(int *)&local_fe8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar wavelength set wavelength count",0x25);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x40,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])((ulong)local_1028 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"solar.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",local_bf0,(Integration_Rule_Type *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar integration rule type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])0x3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"solar.integration_rule.k","1.0",&local_be8,(double *)local_1028
            );
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar integration rule k",0x18);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])((ulong)local_1028 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"solar.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             local_be0,(Wavelength_Boundary_Type *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar minimum wavelength type",0x1d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])&DAT_3fd3333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"solar.min_wavelength.value","0.3",&local_bd8,
             (double *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar minimum wavelength value",0x1e);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])((ulong)local_1028 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"solar.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             local_bd0,(Wavelength_Boundary_Type *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar maximum wavelength type",0x1d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])&DAT_4004000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"solar.max_wavelength.value","2.5",&local_bc8,
             (double *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Solar maximum wavelength value",0x1e);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_10c8,"photopic.name","\"PHOTOPIC\"",&local_e80.name,
             (char (*) [9])"PHOTOPIC");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Photopic method type",0x14);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"photopic.source_spectrum.type","Spectrum_Type::FILE",
             &local_e80.source_spectrum.type,(Spectrum_Type *)local_1028);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Photopic source spectrum type",0x1d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])
               ((long)local_e80.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_e80.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_fe8._M_head_impl._0_4_ = 0x213;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"photopic.source_spectrum.values.size()","531",
             (unsigned_long *)local_1028,(int *)&local_fe8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1028);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1028 + 0x10),"Photopic source spectrum wavelength count",0x29
              );
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fe8,(Message *)local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fe8);
    if (local_1028 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1028 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1028 = (undefined1  [8])&DAT_3fd3333333333333;
  pbStack_1020 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x3fa1758e219652bd;
  local_fe8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fea8f5c28f5c28f
  ;
  uStack_fe0 = 0x404e280000000000;
  PAIR_NEAR((pair<double,_double> *)local_f38,
            local_e80.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_f38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ee8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ee8._M_head_impl + 0x10),"Photopic source spectrum first point",
               0x24);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f38,
               (AssertionResult *)
               "PAIR_NEAR(photopic.source_spectrum.values[0], photopic_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1048,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4e,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1048,(Message *)&local_ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1048);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_ee8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ee8._M_head_impl + 8))();
    }
  }
  if (pbStack_f30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f30,pbStack_f30);
  }
  PAIR_NEAR((pair<double,_double> *)local_f38,
            local_e80.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x212,1e-14);
  if (local_f38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ee8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ee8._M_head_impl + 0x10),"Photopic source spectrum last point",0x23
              );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f38,
               (AssertionResult *)
               "PAIR_NEAR(photopic.source_spectrum.values[530], photopic_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1048,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4f,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1048,(Message *)&local_ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1048);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_ee8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ee8._M_head_impl + 8))();
    }
  }
  if (pbStack_f30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f30,pbStack_f30);
  }
  local_f38._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"photopic.detector_spectrum.type","Spectrum_Type::FILE",
             &local_e80.detector_spectrum.type,(Spectrum_Type *)local_f38);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f38 + 0x10),"Photopic detector spectrum type",0x1f);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ee8,(Message *)local_f38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ee8);
    if (local_f38 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f38 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f38 = (undefined1  [8])
              ((long)local_e80.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_e80.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_ee8._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"photopic.detector_spectrum.values.size()","81",
             (unsigned_long *)local_f38,(int *)&local_ee8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f38 + 0x10),"Photopic detector spectrum wavelength count",
               0x2b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ee8,(Message *)local_f38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ee8);
    if (local_f38 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f38 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f38 = (undefined1  [8])0x3fd8a3d70a3d70a4;
  pbStack_f30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x3f1a36e2eb1c432d;
  local_ee8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe851eb851eb852
  ;
  uStack_ee0 = 0x3f1a36e2eb1c432d;
  PAIR_NEAR((pair<double,_double> *)local_1048,
            local_e80.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1,1e-14);
  if (local_1048[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fb8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fb8._M_head_impl + 0x10),
               "Photopic detector spectrum first nonzero point",0x2e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1048,
               (AssertionResult *)
               "PAIR_NEAR(photopic.detector_spectrum.values[1], photopic_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x54,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f48,(Message *)&local_fb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f48);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fb8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fb8._M_head_impl + 8))();
    }
  }
  if (pbStack_1040 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1040,pbStack_1040);
  }
  PAIR_NEAR((pair<double,_double> *)local_1048,
            local_e80.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x4c,1e-14);
  if (local_1048[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fb8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fb8._M_head_impl + 0x10),
               "Photopic detector spectrum last nonzero point",0x2d);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1048,
               (AssertionResult *)
               "PAIR_NEAR(photopic.detector_spectrum.values[76], photopic_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x55,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f48,(Message *)&local_fb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f48);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fb8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fb8._M_head_impl + 8))();
    }
  }
  if (pbStack_1040 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1040,pbStack_1040);
  }
  local_1048 = (undefined1  [8])((ulong)(uint)local_1048._4_4_ << 0x20);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"photopic.wavelength_set.type","Wavelength_Set_Type::FILE",
             &local_e80.wavelength_set.type,(Wavelength_Set_Type *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic wavelength set type",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])
               ((long)local_e80.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_e80.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_fb8._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"photopic.wavelength_set.values.size()","81",
             (unsigned_long *)local_1048,(int *)&local_fb8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic wavelength set wavelength count",0x28)
    ;
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"photopic.wavelength_set.values[0]","0.38",
             local_e80.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,(double *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic wavelength set first point",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"photopic.wavelength_set.values[80]","0.78",
             local_e80.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + 0x50,(double *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic wavelength set last point",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])((ulong)local_1048 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"photopic.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",&local_e80.integration_rule.type,
             (Integration_Rule_Type *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic integration rule type",0x1e);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"photopic.integration_rule.k","1.0",
             &local_e80.integration_rule.k,(double *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic integration rule k",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])((ulong)local_1048 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"photopic.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",&local_e80.min_wavelength.type,
             (Wavelength_Boundary_Type *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic minimum wavelength type",0x20);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"photopic.min_wavelength.value","0.38",
             &local_e80.min_wavelength.value,(double *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic minimum wavelength value",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])((ulong)local_1048 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"photopic.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",&local_e80.max_wavelength.type,
             (Wavelength_Boundary_Type *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic maximum wavelength type",0x20);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"photopic.max_wavelength.value","0.78",
             &local_e80.max_wavelength.value,(double *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Photopic maximum wavelength value",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[15]>
            ((internal *)local_10c8,"tristim_x.name","\"COLOR_TRISTIMX\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0,
             (char (*) [15])"COLOR_TRISTIMX");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Tristim X method type",0x15);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tristim_x.source_spectrum.type","Spectrum_Type::FILE",local_b80
             ,(Spectrum_Type *)local_1048);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Tristim X source spectrum type",0x1e);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])((long)local_b38 - (long)local_b40 >> 4);
  local_fb8._M_head_impl._0_4_ = 0x213;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_x.source_spectrum.values.size()","531",
             (unsigned_long *)local_1048,(int *)&local_fb8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1048);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1048 + 0x10),"Tristim_x source spectrum wavelength count",
               0x2a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fb8,(Message *)local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fb8);
    if (local_1048 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1048 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1048 = (undefined1  [8])&DAT_3fd3333333333333;
  pbStack_1040 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x3fa1758e219652bd;
  local_fb8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fea8f5c28f5c28f
  ;
  uStack_fb0 = 0x404e280000000000;
  PAIR_NEAR((pair<double,_double> *)local_f48,local_b40,1e-14);
  if (local_f48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ef8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ef8._M_head_impl + 0x10),"Tristim_x source spectrum first point",
               0x25);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f48,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.source_spectrum.values[0], tristim_x_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1058,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x66,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1058,(Message *)&local_ef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1058);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_ef8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ef8._M_head_impl + 8))();
    }
  }
  if (pbStack_f40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f40,pbStack_f40);
  }
  PAIR_NEAR((pair<double,_double> *)local_f48,local_b40 + 0x212,1e-14);
  if (local_f48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ef8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ef8._M_head_impl + 0x10),"Tristim_x source spectrum last point",
               0x24);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f48,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.source_spectrum.values[530], tristim_x_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1058,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x67,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1058,(Message *)&local_ef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1058);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_ef8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ef8._M_head_impl + 8))();
    }
  }
  if (pbStack_f40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f40,pbStack_f40);
  }
  local_f48._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tristim_x.detector_spectrum.type","Spectrum_Type::FILE",
             local_b28,(Spectrum_Type *)local_f48);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f48 + 0x10),"Tristim_x detector spectrum type",0x20);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ef8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ef8,(Message *)local_f48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ef8);
    if (local_f48 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f48 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f48 = (undefined1  [8])((long)local_ae0 - (long)local_ae8 >> 4);
  local_ef8._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_x.detector_spectrum.values.size()","81",
             (unsigned_long *)local_f48,(int *)&local_ef8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f48 + 0x10),"Tristim_x detector spectrum wavelength count",
               0x2c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ef8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ef8,(Message *)local_f48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ef8);
    if (local_f48 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f48 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f48 = (undefined1  [8])&DAT_3fd851eb851eb852;
  pbStack_f40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x3f2a36e2eb1c432d;
  local_ef8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe8a3d70a3d70a4
  ;
  uStack_ef0 = 0x3f1a36e2eb1c432d;
  PAIR_NEAR((pair<double,_double> *)local_1058,local_ae8,1e-14);
  if (local_1058[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fc8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fc8._M_head_impl + 0x10),
               "Tristim_x detector spectrum first nonzero point",0x2f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1058,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.detector_spectrum.values[0], tristim_x_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6c,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f58,(Message *)&local_fc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f58);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fc8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fc8._M_head_impl + 8))();
    }
  }
  if (pbStack_1050 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1050,pbStack_1050);
  }
  PAIR_NEAR((pair<double,_double> *)local_1058,local_ae8 + 0x4e,1e-14);
  if (local_1058[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fc8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fc8._M_head_impl + 0x10),
               "Tristim_x detector spectrum last nonzero point",0x2e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1058,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.detector_spectrum.values[78], tristim_x_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6d,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f58,(Message *)&local_fc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f58);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fc8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fc8._M_head_impl + 8))();
    }
  }
  if (pbStack_1050 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1050,pbStack_1050);
  }
  local_1058 = (undefined1  [8])((ulong)(uint)local_1058._4_4_ << 0x20);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"tristim_x.wavelength_set.type","Wavelength_Set_Type::FILE",
             local_ad0,(Wavelength_Set_Type *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x wavelength set type",0x1d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])((long)local_aa0 - (long)local_aa8 >> 3);
  local_fc8._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_x.wavelength_set.values.size()","81",
             (unsigned_long *)local_1058,(int *)&local_fc8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x wavelength set wavelength count",0x29
              );
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_x.wavelength_set.values[0]","0.38",local_aa8,
             (double *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x wavelength set first point",0x24);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_x.wavelength_set.values[80]","0.78",local_aa8 + 0x50,
             (double *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x wavelength set last point",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])((ulong)local_1058 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"tristim_x.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",local_a90,(Integration_Rule_Type *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x integration rule type",0x1f);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_x.integration_rule.k","1.0",&local_a88,
             (double *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x integration rule k",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])((ulong)local_1058 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tristim_x.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",local_a80,(Wavelength_Boundary_Type *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x minimum wavelength type",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_x.min_wavelength.value","0.38",&local_a78,
             (double *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x minimum wavelength value",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])((ulong)local_1058 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tristim_x.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",local_a70,(Wavelength_Boundary_Type *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x maximum wavelength type",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_x.max_wavelength.value","0.78",&local_a68,
             (double *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_x maximum wavelength value",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[15]>
            ((internal *)local_10c8,"tristim_y.name","\"COLOR_TRISTIMY\"",&local_900.name,
             (char (*) [15])"COLOR_TRISTIMY");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim Y method type",0x15);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tristim_y.source_spectrum.type","Spectrum_Type::FILE",
             &local_900.source_spectrum.type,(Spectrum_Type *)local_1058);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim Y source spectrum type",0x1e);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])
               ((long)local_900.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_900.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_fc8._M_head_impl._0_4_ = 0x213;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_y.source_spectrum.values.size()","531",
             (unsigned_long *)local_1058,(int *)&local_fc8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1058 + 0x10),"Tristim_y source spectrum wavelength count",
               0x2a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fc8,(Message *)local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fc8);
    if (local_1058 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1058 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1058 = (undefined1  [8])&DAT_3fd3333333333333;
  pbStack_1050 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x3fa1758e219652bd;
  local_fc8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fea8f5c28f5c28f
  ;
  uStack_fc0 = 0x404e280000000000;
  PAIR_NEAR((pair<double,_double> *)local_f58,
            local_900.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_f58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f08);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f08._M_head_impl + 0x10),"Tristim_y source spectrum first point",
               0x25);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f58,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.source_spectrum.values[0], tristim_y_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1068,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7e,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1068,(Message *)&local_f08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1068);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f08._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f08._M_head_impl + 8))();
    }
  }
  if (pbStack_f50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f50,pbStack_f50);
  }
  PAIR_NEAR((pair<double,_double> *)local_f58,
            local_900.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x212,1e-14);
  if (local_f58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f08);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f08._M_head_impl + 0x10),"Tristim_y source spectrum last point",
               0x24);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f58,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.source_spectrum.values[530], tristim_y_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1068,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7f,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1068,(Message *)&local_f08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1068);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f08._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f08._M_head_impl + 8))();
    }
  }
  if (pbStack_f50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f50,pbStack_f50);
  }
  local_f58._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tristim_y.detector_spectrum.type","Spectrum_Type::FILE",
             &local_900.detector_spectrum.type,(Spectrum_Type *)local_f58);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f58);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f58 + 0x10),"Tristim_y detector spectrum type",0x20);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f08,(Message *)local_f58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f08);
    if (local_f58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f58 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f58 = (undefined1  [8])
              ((long)local_900.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_900.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_f08._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_y.detector_spectrum.values.size()","81",
             (unsigned_long *)local_f58,(int *)&local_f08);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f58);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f58 + 0x10),"Tristim_y detector spectrum wavelength count",
               0x2c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f08,(Message *)local_f58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f08);
    if (local_f58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f58 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f58 = (undefined1  [8])0x3fd8a3d70a3d70a4;
  pbStack_f50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x3f1a36e2eb1c432d;
  local_f08._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe828f5c28f5c29
  ;
  uStack_f00 = 0x3f1a36e2eb1c432d;
  PAIR_NEAR((pair<double,_double> *)local_1068,
            local_900.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1,1e-14);
  if (local_1068[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fd8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fd8._M_head_impl + 0x10),
               "Tristim_y detector spectrum first nonzero point",0x2f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1068,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.detector_spectrum.values[1], tristim_y_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x84,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f68,(Message *)&local_fd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f68);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fd8._M_head_impl + 8))();
    }
  }
  if (pbStack_1060 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1060,pbStack_1060);
  }
  PAIR_NEAR((pair<double,_double> *)local_1068,
            local_900.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x4b,1e-14);
  if (local_1068[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fd8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fd8._M_head_impl + 0x10),
               "Tristim_y detector spectrum last nonzero point",0x2e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1068,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.detector_spectrum.values[75], tristim_y_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x85,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f68,(Message *)&local_fd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f68);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fd8._M_head_impl + 8))();
    }
  }
  if (pbStack_1060 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1060,pbStack_1060);
  }
  local_1068 = (undefined1  [8])((ulong)(uint)local_1068._4_4_ << 0x20);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"tristim_y.wavelength_set.type","Wavelength_Set_Type::FILE",
             &local_900.wavelength_set.type,(Wavelength_Set_Type *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y wavelength set type",0x1d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])
               ((long)local_900.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_900.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_fd8._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_y.wavelength_set.values.size()","81",
             (unsigned_long *)local_1068,(int *)&local_fd8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y wavelength set wavelength count",0x29
              );
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_y.wavelength_set.values[0]","0.38",
             local_900.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,(double *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y wavelength set first point",0x24);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_y.wavelength_set.values[80]","0.78",
             local_900.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + 0x50,(double *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y wavelength set last point",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])((ulong)local_1068 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"tristim_y.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",&local_900.integration_rule.type,
             (Integration_Rule_Type *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y integration rule type",0x1f);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_y.integration_rule.k","1.0",
             &local_900.integration_rule.k,(double *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y integration rule k",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])((ulong)local_1068 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tristim_y.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",&local_900.min_wavelength.type,
             (Wavelength_Boundary_Type *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y minimum wavelength type",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_y.min_wavelength.value","0.38",
             &local_900.min_wavelength.value,(double *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y minimum wavelength value",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])((ulong)local_1068 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tristim_y.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",&local_900.max_wavelength.type,
             (Wavelength_Boundary_Type *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y maximum wavelength type",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_y.max_wavelength.value","0.78",
             &local_900.max_wavelength.value,(double *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_y maximum wavelength value",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[15]>
            ((internal *)local_10c8,"tristim_z.name","\"COLOR_TRISTIMZ\"",&local_a60.name,
             (char (*) [15])"COLOR_TRISTIMZ");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim Z method type",0x15);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tristim_z.source_spectrum.type","Spectrum_Type::FILE",
             &local_a60.source_spectrum.type,(Spectrum_Type *)local_1068);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim Z source spectrum type",0x1e);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])
               ((long)local_a60.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a60.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_fd8._M_head_impl._0_4_ = 0x213;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_z.source_spectrum.values.size()","531",
             (unsigned_long *)local_1068,(int *)&local_fd8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1068);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1068 + 0x10),"Tristim_z source spectrum wavelength count",
               0x2a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fd8,(Message *)local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fd8);
    if (local_1068 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1068 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1068 = (undefined1  [8])&DAT_3fd3333333333333;
  pbStack_1060 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x3fa1758e219652bd;
  local_fd8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fea8f5c28f5c28f
  ;
  uStack_fd0 = 0x404e280000000000;
  PAIR_NEAR((pair<double,_double> *)local_f68,
            local_a60.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_f68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f18._M_head_impl + 0x10),"Tristim_z source spectrum first point",
               0x25);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f68,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.source_spectrum.values[0], tristim_z_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_10a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x96,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_10a8,(Message *)&local_f18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_10a8);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f18._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f18._M_head_impl + 8))();
    }
  }
  if (pbStack_f60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f60,pbStack_f60);
  }
  PAIR_NEAR((pair<double,_double> *)local_f68,
            local_a60.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x212,1e-14);
  if (local_f68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f18._M_head_impl + 0x10),"Tristim_z source spectrum last point",
               0x24);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f68,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.source_spectrum.values[530], tristim_z_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_10a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x97,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_10a8,(Message *)&local_f18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_10a8);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f18._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f18._M_head_impl + 8))();
    }
  }
  if (pbStack_f60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f60,pbStack_f60);
  }
  local_f68._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tristim_z.detector_spectrum.type","Spectrum_Type::FILE",
             &local_a60.detector_spectrum.type,(Spectrum_Type *)local_f68);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f68 + 0x10),"Tristim_z detector spectrum type",0x20);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f18,(Message *)local_f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f18);
    if (local_f68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f68 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f68 = (undefined1  [8])
              ((long)local_a60.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a60.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_f18._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_z.detector_spectrum.values.size()","81",
             (unsigned_long *)local_f68,(int *)&local_f18);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f68 + 0x10),"Tristim_z detector spectrum wavelength count",
               0x2c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f18,(Message *)local_f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f18);
    if (local_f68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f68 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f68 = (undefined1  [8])&DAT_3fd851eb851eb852;
  pbStack_f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x3f46f0068db8bac7;
  local_f18._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe1c28f5c28f5c3
  ;
  uStack_f10 = 0x3f5205bc01a36e2f;
  PAIR_NEAR((pair<double,_double> *)local_10a8,
            local_a60.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_10a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1098);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1098._M_head_impl + 0x10),
               "Tristim_z detector spectrum first nonzero point",0x2f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_10a8,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.detector_spectrum.values[0], tristim_z_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1038,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9c,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1038,(Message *)&local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1038);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_1098._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1098._M_head_impl + 8))();
    }
  }
  if (pbStack_10a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_10a0,pbStack_10a0);
  }
  PAIR_NEAR((pair<double,_double> *)local_10a8,
            local_a60.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x23,1e-14);
  if (local_10a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1098);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1098._M_head_impl + 0x10),
               "Tristim_z detector spectrum last nonzero point",0x2e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_10a8,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.detector_spectrum.values[35], tristim_z_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1038,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9d,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1038,(Message *)&local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1038);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_1098._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1098._M_head_impl + 8))();
    }
  }
  if (pbStack_10a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_10a0,pbStack_10a0);
  }
  local_10a8 = (undefined1  [8])((ulong)(uint)local_10a8._4_4_ << 0x20);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"tristim_z.wavelength_set.type","Wavelength_Set_Type::FILE",
             &local_a60.wavelength_set.type,(Wavelength_Set_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z wavelength set type",0x1d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])
               ((long)local_a60.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a60.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_1098._M_head_impl._0_4_ = 0x51;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tristim_z.wavelength_set.values.size()","81",
             (unsigned_long *)local_10a8,(int *)&local_1098);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z wavelength set wavelength count",0x29
              );
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_z.wavelength_set.values[0]","0.38",
             local_a60.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,(double *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z wavelength set first point",0x24);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_z.wavelength_set.values[80]","0.78",
             local_a60.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + 0x50,(double *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z wavelength set last point",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])((ulong)local_10a8 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"tristim_z.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",&local_a60.integration_rule.type,
             (Integration_Rule_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z integration rule type",0x1f);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_z.integration_rule.k","1.0",
             &local_a60.integration_rule.k,(double *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z integration rule k",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])((ulong)local_10a8 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tristim_z.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",&local_a60.min_wavelength.type,
             (Wavelength_Boundary_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z minimum wavelength type",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_z.min_wavelength.value","0.38",
             &local_a60.min_wavelength.value,(double *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z minimum wavelength value",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])((ulong)local_10a8 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tristim_z.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",&local_a60.max_wavelength.type,
             (Wavelength_Boundary_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z maximum wavelength type",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_3fe8f5c28f5c28f6;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tristim_z.max_wavelength.value","0.78",
             &local_a60.max_wavelength.value,(double *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Tristim_z maximum wavelength value",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[11]>
            ((internal *)local_10c8,"thermal_ir.name","\"THERMAL IR\"",&local_190.name,
             (char (*) [11])"THERMAL IR");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal IR method type",0x16);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8._0_4_ = 2;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"thermal_ir.source_spectrum.type","Spectrum_Type::BLACKBODY",
             &local_190.source_spectrum.type,(Spectrum_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR source spectrum type",0x1f);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])
               ((long)local_190.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_190.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_1098._M_head_impl = local_1098._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"thermal_ir.source_spectrum.values.size()","0",
             (unsigned_long *)local_10a8,(int *)&local_1098);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR source spectrum wavelength count",
               0x2b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8._0_4_ = 300;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)local_10c8,"thermal_ir.source_spectrum.t","300",
             &local_190.source_spectrum.t,(int *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR source spectrum t",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])((ulong)local_10a8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"thermal_ir.detector_spectrum.type","Spectrum_Type::NONE",
             &local_190.detector_spectrum.type,(Spectrum_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR detector spectrum type",0x21);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])
               ((long)local_190.detector_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_190.detector_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_1098._M_head_impl = local_1098._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"thermal_ir.detector_spectrum.values.size()","0",
             (unsigned_long *)local_10a8,(int *)&local_1098);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR detector spectrum wavelength count",
               0x2d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8._0_4_ = 2;
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"thermal_ir.wavelength_set.type","Wavelength_Set_Type::DATA",
             &local_190.wavelength_set.type,(Wavelength_Set_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR wavelength set type",0x1e);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])
               ((long)local_190.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_190.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_1098._M_head_impl = local_1098._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"thermal_ir.wavelength_set.values.size()","0",
             (unsigned_long *)local_10a8,(int *)&local_1098);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR wavelength set wavelength count",
               0x2a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])((ulong)local_10a8 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"thermal_ir.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",&local_190.integration_rule.type,
             (Integration_Rule_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR integration rule type",0x20);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"thermal_ir.integration_rule.k","1.0",
             &local_190.integration_rule.k,(double *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR integration rule k",0x1d);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])((ulong)local_10a8 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"thermal_ir.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",&local_190.min_wavelength.type,
             (Wavelength_Boundary_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR minimum wavelength type",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_4014000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"thermal_ir.min_wavelength.value","5.0",
             &local_190.min_wavelength.value,(double *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR minimum wavelength value",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8._0_4_ = 1;
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"thermal_ir.max_wavelength.type",
             "Wavelength_Boundary_Type::WAVELENGTH_SET",&local_190.max_wavelength.type,
             (Wavelength_Boundary_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"Thermal_IR maximum wavelength type",0x22);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_10c8,"tuv.name","\"TUV\"",&local_2f0.name,(char (*) [4])"TUV");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"TUV method type",0xf);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tuv.source_spectrum.type","Spectrum_Type::FILE",
             &local_2f0.source_spectrum.type,(Spectrum_Type *)local_10a8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"TUV source spectrum type",0x18);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])
               ((long)local_2f0.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2f0.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_1098._M_head_impl._0_4_ = 0x79;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tuv.source_spectrum.values.size()","121",
             (unsigned_long *)local_10a8,(int *)&local_1098);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_10a8 + 0x10),"TUV source spectrum wavelength count",0x24);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1098,(Message *)local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1098);
    if (local_10a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_10a8 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_10a8 = (undefined1  [8])&DAT_3fd3333333333333;
  pbStack_10a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1098._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40102e147ae147ae
  ;
  uStack_1090 = 0x401b99999999999a;
  PAIR_NEAR((pair<double,_double> *)local_1038,
            local_2f0.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_1038[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fa8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fa8._M_head_impl + 0x10),"TUV source spectrum first point",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1038,
               (AssertionResult *)
               "PAIR_NEAR(tuv.source_spectrum.values[0], tuv_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbc,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f78,(Message *)&local_fa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f78);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fa8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fa8._M_head_impl + 8))();
    }
  }
  if (pbStack_1030 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1030,pbStack_1030);
  }
  PAIR_NEAR((pair<double,_double> *)local_1038,
            local_2f0.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x78,1e-14);
  if (local_1038[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_fa8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_fa8._M_head_impl + 0x10),"TUV source spectrum last point",0x1e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1038,
               (AssertionResult *)
               "PAIR_NEAR(tuv.source_spectrum.values[120], tuv_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbd,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f78,(Message *)&local_fa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f78);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_fa8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_fa8._M_head_impl + 8))();
    }
  }
  if (pbStack_1030 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1030,pbStack_1030);
  }
  local_1038 = (undefined1  [8])((ulong)(uint)local_1038._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tuv.detector_spectrum.type","Spectrum_Type::NONE",
             &local_2f0.detector_spectrum.type,(Spectrum_Type *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV detector spectrum type",0x1a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038._0_4_ = 1;
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"tuv.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             &local_2f0.wavelength_set.type,(Wavelength_Set_Type *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV wavelength set type",0x17);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])
               ((long)local_2f0.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_2f0.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_fa8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_fa8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tuv.wavelength_set.values.size()","0",
             (unsigned_long *)local_1038,(int *)&local_fa8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV wavelength set wavelength count",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])((ulong)local_1038 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"tuv.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,&local_2f0.integration_rule.type,(Integration_Rule_Type *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV integration rule type",0x19);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tuv.integration_rule.k","1.0",&local_2f0.integration_rule.k,
             (double *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV integration rule k",0x16);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])((ulong)local_1038 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tuv.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_2f0.min_wavelength.type,(Wavelength_Boundary_Type *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV minimum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])&DAT_3fd3d70a3d70a3d7;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tuv.min_wavelength.value","0.31",
             &local_2f0.min_wavelength.value,(double *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV minimum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])((ulong)local_1038 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tuv.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_2f0.max_wavelength.type,(Wavelength_Boundary_Type *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV maximum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])&DAT_3fd851eb851eb852;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tuv.max_wavelength.value","0.38",
             &local_2f0.max_wavelength.value,(double *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"TUV maximum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_10c8,"spf.name","\"SPF\"",&local_640.name,(char (*) [4])"SPF");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"SPF method type",0xf);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"spf.source_spectrum.type","Spectrum_Type::FILE",
             &local_640.source_spectrum.type,(Spectrum_Type *)local_1038);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"SPF source spectrum type",0x18);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])
               ((long)local_640.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_640.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_fa8._M_head_impl._0_4_ = 0x3d;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"spf.source_spectrum.values.size()","61",
             (unsigned_long *)local_1038,(int *)&local_fa8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1038);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1038 + 0x10),"SPF source spectrum wavelength count",0x24);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xca,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_fa8,(Message *)local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_fa8);
    if (local_1038 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1038 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1038 = (undefined1  [8])&DAT_3fd1eb851eb851ec;
  pbStack_1030 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x3dc6a6626feb1d5c;
  local_fa8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fd999999999999a;
  uStack_fa0 = 0x3f1a79fec99f1ae3;
  PAIR_NEAR((pair<double,_double> *)local_f78,
            local_640.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_f78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f28._M_head_impl + 0x10),"SPF source spectrum first point",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f78,
               (AssertionResult *)
               "PAIR_NEAR(spf.source_spectrum.values[0], spf_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xcd,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1018,(Message *)&local_f28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1018);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f28._M_head_impl + 8))();
    }
  }
  if (pbStack_f70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f70,pbStack_f70);
  }
  PAIR_NEAR((pair<double,_double> *)local_f78,
            local_640.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x3c,1e-14);
  if (local_f78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f28._M_head_impl + 0x10),"SPF source spectrum last point",0x1e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_f78,
               (AssertionResult *)
               "PAIR_NEAR(spf.source_spectrum.values[60], spf_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xce,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1018,(Message *)&local_f28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1018);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f28._M_head_impl + 8))();
    }
  }
  if (pbStack_f70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f70,pbStack_f70);
  }
  local_f78._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"spf.detector_spectrum.type","Spectrum_Type::FILE",
             &local_640.detector_spectrum.type,(Spectrum_Type *)local_f78);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f78 + 0x10),"SPF detector spectrum type",0x1a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xcf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f28,(Message *)local_f78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f28);
    if (local_f78 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f78 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f78 = (undefined1  [8])
              ((long)local_640.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_640.detector_spectrum.values.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_f28._M_head_impl._0_4_ = 0x3d;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"spf.detector_spectrum.values.size()","61",
             (unsigned_long *)local_f78,(int *)&local_f28);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f78 + 0x10),"SPF detector spectrum wavelength count",0x26);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f28,(Message *)local_f78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f28);
    if (local_f78 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f78 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_f78 = (undefined1  [8])&DAT_3fd1eb851eb851ec;
  pbStack_f70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x3ff0000000000000;
  local_f28._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fd999999999999a;
  uStack_f20 = 0x3f1ffb480a5accd5;
  PAIR_NEAR((pair<double,_double> *)local_1018,
            local_640.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_1018[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f98._M_head_impl + 0x10),
               "SPF detector spectrum first nonzero point",0x29);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1018,
               (AssertionResult *)
               "PAIR_NEAR(spf.detector_spectrum.values[0], spf_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1088,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd3,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1088,(Message *)&local_f98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1088);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f98._M_head_impl + 8))();
    }
  }
  if (pbStack_1010 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1010,pbStack_1010);
  }
  PAIR_NEAR((pair<double,_double> *)local_1018,
            local_640.detector_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x3c,1e-14);
  if (local_1018[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f98._M_head_impl + 0x10),"SPF detector spectrum last nonzero point"
               ,0x28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1018,
               (AssertionResult *)
               "PAIR_NEAR(spf.detector_spectrum.values[60], spf_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1088,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd4,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1088,(Message *)&local_f98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1088);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_f98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f98._M_head_impl + 8))();
    }
  }
  if (pbStack_1010 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1010,pbStack_1010);
  }
  local_1018._0_4_ = 1;
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"spf.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             &local_640.wavelength_set.type,(Wavelength_Set_Type *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF wavelength set type",0x17);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])
               ((long)local_640.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_640.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_f98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_f98._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"spf.wavelength_set.values.size()","0",
             (unsigned_long *)local_1018,(int *)&local_f98);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF wavelength set wavelength count",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])((ulong)local_1018 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"spf.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,&local_640.integration_rule.type,(Integration_Rule_Type *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF integration rule type",0x19);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"spf.integration_rule.k","1.0",&local_640.integration_rule.k,
             (double *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF integration rule k",0x16);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])((ulong)local_1018 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"spf.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_640.min_wavelength.type,(Wavelength_Boundary_Type *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF minimum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])&DAT_3fd1eb851eb851ec;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"spf.min_wavelength.value","0.28",
             &local_640.min_wavelength.value,(double *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF minimum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])((ulong)local_1018 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"spf.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_640.max_wavelength.type,(Wavelength_Boundary_Type *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF maximum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])&DAT_3fd999999999999a;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"spf.max_wavelength.value","0.4",&local_640.max_wavelength.value
             ,(double *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"SPF maximum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_10c8,"tdw.name","\"TDW\"",&local_7a0.name,(char (*) [4])"TDW");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"TDW method type",0xf);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tdw.source_spectrum.type","Spectrum_Type::FILE",
             &local_7a0.source_spectrum.type,(Spectrum_Type *)local_1018);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"TDW source spectrum type",0x18);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xdf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])
               ((long)local_7a0.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_7a0.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_f98._M_head_impl._0_4_ = 0x79;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tdw.source_spectrum.values.size()","121",
             (unsigned_long *)local_1018,(int *)&local_f98);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1018);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1018 + 0x10),"TDW source spectrum wavelength count",0x24);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f98,(Message *)local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f98);
    if (local_1018 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1018 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1018 = (undefined1  [8])&DAT_3fd3333333333333;
  pbStack_1010 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40102e147ae147ae
  ;
  uStack_f90 = 0x401b99999999999a;
  PAIR_NEAR((pair<double,_double> *)local_1088,
            local_7a0.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_1088[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ff8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ff8._M_head_impl + 0x10),"TDW source spectrum first point",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1088,
               (AssertionResult *)
               "PAIR_NEAR(tdw.source_spectrum.values[0], tdw_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1008,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe3,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1008,(Message *)&local_ff8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1008);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_ff8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ff8._M_head_impl + 8))();
    }
  }
  if (pbStack_1080 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1080,pbStack_1080);
  }
  PAIR_NEAR((pair<double,_double> *)local_1088,
            local_7a0.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x78,1e-14);
  if (local_1088[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_ff8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_ff8._M_head_impl + 0x10),"TDW source spectrum last point",0x1e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1088,
               (AssertionResult *)
               "PAIR_NEAR(tdw.source_spectrum.values[120], tdw_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1008,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe4,(char *)local_10c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1008,(Message *)&local_ff8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1008);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if (local_ff8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_ff8._M_head_impl + 8))();
    }
  }
  if (pbStack_1080 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1080,pbStack_1080);
  }
  local_1088._0_4_ = 3;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tdw.detector_spectrum.type","Spectrum_Type::UV_ACTION",
             &local_7a0.detector_spectrum.type,(Spectrum_Type *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW detector spectrum type",0x1a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])
               ((long)local_7a0.detector_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_7a0.detector_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_ff8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_ff8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tdw.detector_spectrum.values.size()","0",
             (unsigned_long *)local_1088,(int *)&local_ff8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW detector spectrum wavelength count",0x26);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])&DAT_400ccccccccccccd;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tdw.detector_spectrum.a","3.6",&local_7a0.detector_spectrum.a,
             (double *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW detector spectrum a",0x17);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)local_10c8,"tdw.detector_spectrum.b","12",&local_7a0.detector_spectrum.b,
             (int *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW detector spectrum b",0x17);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088._0_4_ = 1;
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"tdw.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             &local_7a0.wavelength_set.type,(Wavelength_Set_Type *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW wavelength set type",0x17);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])
               ((long)local_7a0.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_7a0.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_ff8._M_head_impl = local_ff8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tdw.wavelength_set.values.size()","0",
             (unsigned_long *)local_1088,(int *)&local_ff8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW wavelength set wavelength count",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])((ulong)local_1088 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"tdw.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,&local_7a0.integration_rule.type,(Integration_Rule_Type *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW integration rule type",0x19);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tdw.integration_rule.k","1.0",&local_7a0.integration_rule.k,
             (double *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW integration rule k",0x16);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])((ulong)local_1088 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tdw.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_7a0.min_wavelength.type,(Wavelength_Boundary_Type *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW minimum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])&DAT_3fd3333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tdw.min_wavelength.value","0.3",&local_7a0.min_wavelength.value
             ,(double *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW minimum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])((ulong)local_1088 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tdw.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_7a0.max_wavelength.type,(Wavelength_Boundary_Type *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW maximum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])&DAT_3fe6666666666666;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tdw.max_wavelength.value","0.7",&local_7a0.max_wavelength.value
             ,(double *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TDW maximum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_10c8,"tkr.name","\"TKR\"",&local_4e0.name,(char (*) [4])"TKR");
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TKR method type",0xf);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088._0_4_ = 1;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tkr.source_spectrum.type","Spectrum_Type::FILE",
             &local_4e0.source_spectrum.type,(Spectrum_Type *)local_1088);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TKR source spectrum type",0x18);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])
               ((long)local_4e0.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_4e0.source_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_ff8._M_head_impl._0_4_ = 0x79;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tkr.source_spectrum.values.size()","121",
             (unsigned_long *)local_1088,(int *)&local_ff8);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1088);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1088 + 0x10),"TKR source spectrum wavelength count",0x24);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_ff8,(Message *)local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ff8);
    if (local_1088 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1088 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1088 = (undefined1  [8])&DAT_3fd3333333333333;
  pbStack_1080 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_ff8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40102e147ae147ae
  ;
  uStack_ff0 = 0x401b99999999999a;
  PAIR_NEAR((pair<double,_double> *)local_1008,
            local_4e0.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start,1e-14);
  if (local_1008[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1070);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_1070.data_._4_4_,local_1070.data_._0_4_) + 0x10),
               "TKR source spectrum first point",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1008,
               (AssertionResult *)
               "PAIR_NEAR(tkr.source_spectrum.values[0], tkr_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_ec0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf7,(char *)local_10c8);
    testing::internal::AssertHelper::operator=(&local_ec0,(Message *)&local_1070);
    testing::internal::AssertHelper::~AssertHelper(&local_ec0);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1070.data_._4_4_,local_1070.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1070.data_._4_4_,local_1070.data_._0_4_) + 8))();
    }
  }
  if (local_1000 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1000,local_1000);
  }
  PAIR_NEAR((pair<double,_double> *)local_1008,
            local_4e0.source_spectrum.values.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x78,1e-14);
  if (local_1008[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1070);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_1070.data_._4_4_,local_1070.data_._0_4_) + 0x10),
               "TKR source spectrum last point",0x1e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_10c8,(internal *)local_1008,
               (AssertionResult *)
               "PAIR_NEAR(tkr.source_spectrum.values[120], tkr_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_ec0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf8,(char *)local_10c8);
    testing::internal::AssertHelper::operator=(&local_ec0,(Message *)&local_1070);
    testing::internal::AssertHelper::~AssertHelper(&local_ec0);
    if (local_10c8 != (undefined1  [8])&local_10b8) {
      operator_delete((void *)local_10c8,local_10b8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1070.data_._4_4_,local_1070.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1070.data_._4_4_,local_1070.data_._0_4_) + 8))();
    }
  }
  if (local_1000 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1000,local_1000);
  }
  local_1008._0_4_ = 4;
  testing::internal::CmpHelperEQ<window_standards::Spectrum_Type,window_standards::Spectrum_Type>
            ((internal *)local_10c8,"tkr.detector_spectrum.type","Spectrum_Type::KROCHMANN",
             &local_4e0.detector_spectrum.type,(Spectrum_Type *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR detector spectrum type",0x1a);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])
               ((long)local_4e0.detector_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_4e0.detector_spectrum.values.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_1070.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tkr.detector_spectrum.values.size()","0",
             (unsigned_long *)local_1008,(int *)&local_1070);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR detector spectrum wavelength count",0x26);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008._0_4_ = 1;
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Set_Type,window_standards::Wavelength_Set_Type>
            ((internal *)local_10c8,"tkr.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             &local_4e0.wavelength_set.type,(Wavelength_Set_Type *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR wavelength set type",0x17);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])
               ((long)local_4e0.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_4e0.wavelength_set.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_1070.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_10c8,"tkr.wavelength_set.values.size()","0",
             (unsigned_long *)local_1008,(int *)&local_1070);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR wavelength set wavelength count",0x23);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])((ulong)local_1008 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Integration_Rule_Type,window_standards::Integration_Rule_Type>
            ((internal *)local_10c8,"tkr.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,&local_4e0.integration_rule.type,(Integration_Rule_Type *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR integration rule type",0x19);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tkr.integration_rule.k","1.0",&local_4e0.integration_rule.k,
             (double *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR integration rule k",0x16);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])((ulong)local_1008 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tkr.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_4e0.min_wavelength.type,(Wavelength_Boundary_Type *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR minimum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xff,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])&DAT_3fd3333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tkr.min_wavelength.value","0.3",&local_4e0.min_wavelength.value
             ,(double *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR minimum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])((ulong)local_1008 & 0xffffffff00000000);
  testing::internal::
  CmpHelperEQ<window_standards::Wavelength_Boundary_Type,window_standards::Wavelength_Boundary_Type>
            ((internal *)local_10c8,"tkr.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             &local_4e0.max_wavelength.type,(Wavelength_Boundary_Type *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR maximum wavelength type",0x1b);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x101,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  local_1008 = (undefined1  [8])&DAT_3fe0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_10c8,"tkr.max_wavelength.value","0.5",&local_4e0.max_wavelength.value
             ,(double *)local_1008);
  if (local_10c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1008);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_1008 + 0x10),"TKR maximum wavelength value",0x1c);
    if (local_10c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_10c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x102,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,(Message *)local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    if (local_1008 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1008 + 8))();
    }
  }
  if (local_10c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10c0,local_10c0);
  }
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_4e0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_7a0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_640);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_2f0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_190);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_a60);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_900);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_bc0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method(&local_e80);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_d20);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
  ::~_Rb_tree(&this_00->_M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.file._M_dataplus._M_p != &local_380.file.field_2) {
    operator_delete(local_380.file._M_dataplus._M_p,local_380.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.description._M_dataplus._M_p != &local_380.description.field_2) {
    operator_delete(local_380.description._M_dataplus._M_p,
                    local_380.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.name._M_dataplus._M_p != &local_380.name.field_2) {
    operator_delete(local_380.name._M_dataplus._M_p,local_380.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::filesystem::__cxx11::path::~path(&local_ea8);
  testing::ScopedTrace::~ScopedTrace(&local_f79);
  return;
}

Assistant:

TEST_F(TestLoadStandardFromDisk, TestLoadNFRC2003) {
	SCOPED_TRACE( "Begin Test: Load NFRC 2003 from disk." );
	
	std::filesystem::path nfrc_std_path(test_dir);
	nfrc_std_path /= "standards";
	nfrc_std_path /= "W5_NFRC_2003.std";

	Optical_Standard nfrc = load_optical_standard(nfrc_std_path.string());
	EXPECT_EQ(nfrc.description, "Consistent with NFRC 300-2003 - default for WINDOW5");
	EXPECT_EQ(nfrc.methods.size(), 10) << "Number of methods loaded";
	Optical_Standard_Method solar = nfrc.methods["SOLAR"];
	Optical_Standard_Method photopic = nfrc.methods["PHOTOPIC"];
	Optical_Standard_Method tristim_x = nfrc.methods["COLOR_TRISTIMX"];
	Optical_Standard_Method tristim_y = nfrc.methods["COLOR_TRISTIMY"];
	Optical_Standard_Method tristim_z = nfrc.methods["COLOR_TRISTIMZ"];
	Optical_Standard_Method thermal_ir = nfrc.methods["THERMAL IR"];
	Optical_Standard_Method tuv = nfrc.methods["TUV"];
	Optical_Standard_Method spf = nfrc.methods["SPF"];
	Optical_Standard_Method tdw = nfrc.methods["TDW"];
	Optical_Standard_Method tkr = nfrc.methods["TKR"];

	EXPECT_EQ(solar.name, "SOLAR") << "Solar method type";
	EXPECT_EQ(solar.source_spectrum.type, Spectrum_Type::FILE) << "Solar source spectrum type";
	EXPECT_EQ(solar.source_spectrum.values.size(), 121) << "Solar source spectrum wavelength count";
	std::pair<double, double> solar_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> solar_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(solar.source_spectrum.values[0], solar_expected_first_wavelength, 1e-14)) << "Solar source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(solar.source_spectrum.values[120], solar_expected_last_wavelength, 1e-14)) << "Solar source spectrum last point";
	EXPECT_EQ(solar.detector_spectrum.type, Spectrum_Type::NONE) << "Solar detector spectrum type";
	EXPECT_EQ(solar.detector_spectrum.values.size(), 0) << "Solar detector spectrum wavelength count";
	EXPECT_EQ(solar.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "Solar wavelength set type";
	EXPECT_EQ(solar.wavelength_set.values.size(), 0) << "Solar wavelength set wavelength count";
	EXPECT_EQ(solar.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Solar integration rule type";
	EXPECT_EQ(solar.integration_rule.k, 1.0) << "Solar integration rule k";
	EXPECT_EQ(solar.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Solar minimum wavelength type";
	EXPECT_EQ(solar.min_wavelength.value, 0.3) << "Solar minimum wavelength value";
	EXPECT_EQ(solar.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Solar maximum wavelength type";
	EXPECT_EQ(solar.max_wavelength.value, 2.5) << "Solar maximum wavelength value";

	EXPECT_EQ(photopic.name, "PHOTOPIC") << "Photopic method type";

	EXPECT_EQ(photopic.source_spectrum.type, Spectrum_Type::FILE) << "Photopic source spectrum type";
	EXPECT_EQ(photopic.source_spectrum.values.size(), 531) << "Photopic source spectrum wavelength count";
	std::pair<double, double> photopic_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> photopic_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(photopic.source_spectrum.values[0], photopic_source_expected_first_wavelength, 1e-14)) << "Photopic source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(photopic.source_spectrum.values[530], photopic_source_expected_last_wavelength, 1e-14)) << "Photopic source spectrum last point";
	EXPECT_EQ(photopic.detector_spectrum.type, Spectrum_Type::FILE) << "Photopic detector spectrum type";
	EXPECT_EQ(photopic.detector_spectrum.values.size(), 81) << "Photopic detector spectrum wavelength count";
	std::pair<double, double> photopic_detector_expected_first_nonzero_wavelength(0.385, 0.0001);
	std::pair<double, double> photopic_detector_expected_last_nonzero_wavelength(0.76, 0.0001);
	EXPECT_TRUE(PAIR_NEAR(photopic.detector_spectrum.values[1], photopic_detector_expected_first_nonzero_wavelength, 1e-14)) << "Photopic detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(photopic.detector_spectrum.values[76], photopic_detector_expected_last_nonzero_wavelength, 1e-14)) << "Photopic detector spectrum last nonzero point";
	EXPECT_EQ(photopic.wavelength_set.type, Wavelength_Set_Type::FILE) << "Photopic wavelength set type";
	EXPECT_EQ(photopic.wavelength_set.values.size(), 81) << "Photopic wavelength set wavelength count";
	EXPECT_EQ(photopic.wavelength_set.values[0], 0.38) << "Photopic wavelength set first point";
	EXPECT_EQ(photopic.wavelength_set.values[80], 0.78) << "Photopic wavelength set last point";
	EXPECT_EQ(photopic.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Photopic integration rule type";
	EXPECT_EQ(photopic.integration_rule.k, 1.0) << "Photopic integration rule k";
	EXPECT_EQ(photopic.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Photopic minimum wavelength type";
	EXPECT_EQ(photopic.min_wavelength.value, 0.38) << "Photopic minimum wavelength value";
	EXPECT_EQ(photopic.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Photopic maximum wavelength type";
	EXPECT_EQ(photopic.max_wavelength.value, 0.78) << "Photopic maximum wavelength value";

	EXPECT_EQ(tristim_x.name, "COLOR_TRISTIMX") << "Tristim X method type";
	EXPECT_EQ(tristim_x.source_spectrum.type, Spectrum_Type::FILE) << "Tristim X source spectrum type";
	EXPECT_EQ(tristim_x.source_spectrum.values.size(), 531) << "Tristim_x source spectrum wavelength count";
	std::pair<double, double> tristim_x_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> tristim_x_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(tristim_x.source_spectrum.values[0], tristim_x_source_expected_first_wavelength, 1e-14)) << "Tristim_x source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tristim_x.source_spectrum.values[530], tristim_x_source_expected_last_wavelength, 1e-14)) << "Tristim_x source spectrum last point";
	EXPECT_EQ(tristim_x.detector_spectrum.type, Spectrum_Type::FILE) << "Tristim_x detector spectrum type";
	EXPECT_EQ(tristim_x.detector_spectrum.values.size(), 81) << "Tristim_x detector spectrum wavelength count";
	std::pair<double, double> tristim_x_detector_expected_first_nonzero_wavelength(0.38, 0.0002);
	std::pair<double, double> tristim_x_detector_expected_last_nonzero_wavelength(0.77, 0.0001);
	EXPECT_TRUE(PAIR_NEAR(tristim_x.detector_spectrum.values[0], tristim_x_detector_expected_first_nonzero_wavelength, 1e-14)) << "Tristim_x detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(tristim_x.detector_spectrum.values[78], tristim_x_detector_expected_last_nonzero_wavelength, 1e-14)) << "Tristim_x detector spectrum last nonzero point";
	EXPECT_EQ(tristim_x.wavelength_set.type, Wavelength_Set_Type::FILE) << "Tristim_x wavelength set type";
	EXPECT_EQ(tristim_x.wavelength_set.values.size(), 81) << "Tristim_x wavelength set wavelength count";
	EXPECT_EQ(tristim_x.wavelength_set.values[0], 0.38) << "Tristim_x wavelength set first point";
	EXPECT_EQ(tristim_x.wavelength_set.values[80], 0.78) << "Tristim_x wavelength set last point";
	EXPECT_EQ(tristim_x.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Tristim_x integration rule type";
	EXPECT_EQ(tristim_x.integration_rule.k, 1.0) << "Tristim_x integration rule k";
	EXPECT_EQ(tristim_x.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_x minimum wavelength type";
	EXPECT_EQ(tristim_x.min_wavelength.value, 0.38) << "Tristim_x minimum wavelength value";
	EXPECT_EQ(tristim_x.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_x maximum wavelength type";
	EXPECT_EQ(tristim_x.max_wavelength.value, 0.78) << "Tristim_x maximum wavelength value";

	EXPECT_EQ(tristim_y.name, "COLOR_TRISTIMY") << "Tristim Y method type";
	EXPECT_EQ(tristim_y.source_spectrum.type, Spectrum_Type::FILE) << "Tristim Y source spectrum type";
	EXPECT_EQ(tristim_y.source_spectrum.values.size(), 531) << "Tristim_y source spectrum wavelength count";
	std::pair<double, double> tristim_y_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> tristim_y_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(tristim_y.source_spectrum.values[0], tristim_y_source_expected_first_wavelength, 1e-14)) << "Tristim_y source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tristim_y.source_spectrum.values[530], tristim_y_source_expected_last_wavelength, 1e-14)) << "Tristim_y source spectrum last point";
	EXPECT_EQ(tristim_y.detector_spectrum.type, Spectrum_Type::FILE) << "Tristim_y detector spectrum type";
	EXPECT_EQ(tristim_y.detector_spectrum.values.size(), 81) << "Tristim_y detector spectrum wavelength count";
	std::pair<double, double> tristim_y_detector_expected_first_nonzero_wavelength(0.385, 0.0001);
	std::pair<double, double> tristim_y_detector_expected_last_nonzero_wavelength(0.755, 0.0001);
	EXPECT_TRUE(PAIR_NEAR(tristim_y.detector_spectrum.values[1], tristim_y_detector_expected_first_nonzero_wavelength, 1e-14)) << "Tristim_y detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(tristim_y.detector_spectrum.values[75], tristim_y_detector_expected_last_nonzero_wavelength, 1e-14)) << "Tristim_y detector spectrum last nonzero point";
	EXPECT_EQ(tristim_y.wavelength_set.type, Wavelength_Set_Type::FILE) << "Tristim_y wavelength set type";
	EXPECT_EQ(tristim_y.wavelength_set.values.size(), 81) << "Tristim_y wavelength set wavelength count";
	EXPECT_EQ(tristim_y.wavelength_set.values[0], 0.38) << "Tristim_y wavelength set first point";
	EXPECT_EQ(tristim_y.wavelength_set.values[80], 0.78) << "Tristim_y wavelength set last point";
	EXPECT_EQ(tristim_y.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Tristim_y integration rule type";
	EXPECT_EQ(tristim_y.integration_rule.k, 1.0) << "Tristim_y integration rule k";
	EXPECT_EQ(tristim_y.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_y minimum wavelength type";
	EXPECT_EQ(tristim_y.min_wavelength.value, 0.38) << "Tristim_y minimum wavelength value";
	EXPECT_EQ(tristim_y.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_y maximum wavelength type";
	EXPECT_EQ(tristim_y.max_wavelength.value, 0.78) << "Tristim_y maximum wavelength value";

	EXPECT_EQ(tristim_z.name, "COLOR_TRISTIMZ") << "Tristim Z method type";
	EXPECT_EQ(tristim_z.source_spectrum.type, Spectrum_Type::FILE) << "Tristim Z source spectrum type";
	EXPECT_EQ(tristim_z.source_spectrum.values.size(), 531) << "Tristim_z source spectrum wavelength count";
	std::pair<double, double> tristim_z_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> tristim_z_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(tristim_z.source_spectrum.values[0], tristim_z_source_expected_first_wavelength, 1e-14)) << "Tristim_z source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tristim_z.source_spectrum.values[530], tristim_z_source_expected_last_wavelength, 1e-14)) << "Tristim_z source spectrum last point";
	EXPECT_EQ(tristim_z.detector_spectrum.type, Spectrum_Type::FILE) << "Tristim_z detector spectrum type";
	EXPECT_EQ(tristim_z.detector_spectrum.values.size(), 81) << "Tristim_z detector spectrum wavelength count";
	std::pair<double, double> tristim_z_detector_expected_first_nonzero_wavelength(0.38, 0.0007);
	std::pair<double, double> tristim_z_detector_expected_last_nonzero_wavelength(0.555, 0.0011);
	EXPECT_TRUE(PAIR_NEAR(tristim_z.detector_spectrum.values[0], tristim_z_detector_expected_first_nonzero_wavelength, 1e-14)) << "Tristim_z detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(tristim_z.detector_spectrum.values[35], tristim_z_detector_expected_last_nonzero_wavelength, 1e-14)) << "Tristim_z detector spectrum last nonzero point";
	EXPECT_EQ(tristim_z.wavelength_set.type, Wavelength_Set_Type::FILE) << "Tristim_z wavelength set type";
	EXPECT_EQ(tristim_z.wavelength_set.values.size(), 81) << "Tristim_z wavelength set wavelength count";
	EXPECT_EQ(tristim_z.wavelength_set.values[0], 0.38) << "Tristim_z wavelength set first point";
	EXPECT_EQ(tristim_z.wavelength_set.values[80], 0.78) << "Tristim_z wavelength set last point";
	EXPECT_EQ(tristim_z.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Tristim_z integration rule type";
	EXPECT_EQ(tristim_z.integration_rule.k, 1.0) << "Tristim_z integration rule k";
	EXPECT_EQ(tristim_z.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_z minimum wavelength type";
	EXPECT_EQ(tristim_z.min_wavelength.value, 0.38) << "Tristim_z minimum wavelength value";
	EXPECT_EQ(tristim_z.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_z maximum wavelength type";
	EXPECT_EQ(tristim_z.max_wavelength.value, 0.78) << "Tristim_z maximum wavelength value";

	EXPECT_EQ(thermal_ir.name, "THERMAL IR") << "Thermal IR method type";
	EXPECT_EQ(thermal_ir.source_spectrum.type, Spectrum_Type::BLACKBODY) << "Thermal_IR source spectrum type";
	EXPECT_EQ(thermal_ir.source_spectrum.values.size(), 0) << "Thermal_IR source spectrum wavelength count";	
	EXPECT_EQ(thermal_ir.source_spectrum.t, 300) << "Thermal_IR source spectrum t";
	EXPECT_EQ(thermal_ir.detector_spectrum.type, Spectrum_Type::NONE) << "Thermal_IR detector spectrum type";
	EXPECT_EQ(thermal_ir.detector_spectrum.values.size(), 0) << "Thermal_IR detector spectrum wavelength count";
	EXPECT_EQ(thermal_ir.wavelength_set.type, Wavelength_Set_Type::DATA) << "Thermal_IR wavelength set type";
	EXPECT_EQ(thermal_ir.wavelength_set.values.size(), 0) << "Thermal_IR wavelength set wavelength count";
	EXPECT_EQ(thermal_ir.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Thermal_IR integration rule type";
	EXPECT_EQ(thermal_ir.integration_rule.k, 1.0) << "Thermal_IR integration rule k";
	EXPECT_EQ(thermal_ir.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Thermal_IR minimum wavelength type";
	EXPECT_EQ(thermal_ir.min_wavelength.value, 5.0) << "Thermal_IR minimum wavelength value";
	EXPECT_EQ(thermal_ir.max_wavelength.type, Wavelength_Boundary_Type::WAVELENGTH_SET) << "Thermal_IR maximum wavelength type";

	EXPECT_EQ(tuv.name, "TUV") << "TUV method type";
	EXPECT_EQ(tuv.source_spectrum.type, Spectrum_Type::FILE) << "TUV source spectrum type";
	EXPECT_EQ(tuv.source_spectrum.values.size(), 121) << "TUV source spectrum wavelength count";
	std::pair<double, double> tuv_source_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> tuv_source_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(tuv.source_spectrum.values[0], tuv_source_expected_first_wavelength, 1e-14)) << "TUV source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tuv.source_spectrum.values[120], tuv_source_expected_last_wavelength, 1e-14)) << "TUV source spectrum last point";
	EXPECT_EQ(tuv.detector_spectrum.type, Spectrum_Type::NONE) << "TUV detector spectrum type";
	EXPECT_EQ(tuv.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "TUV wavelength set type";
	EXPECT_EQ(tuv.wavelength_set.values.size(), 0) << "TUV wavelength set wavelength count";
	EXPECT_EQ(tuv.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "TUV integration rule type";
	EXPECT_EQ(tuv.integration_rule.k, 1.0) << "TUV integration rule k";
	EXPECT_EQ(tuv.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TUV minimum wavelength type";
	EXPECT_EQ(tuv.min_wavelength.value, 0.31) << "TUV minimum wavelength value";
	EXPECT_EQ(tuv.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TUV maximum wavelength type";
	EXPECT_EQ(tuv.max_wavelength.value, 0.38) << "TUV maximum wavelength value";

	EXPECT_EQ(spf.name, "SPF") << "SPF method type";
	EXPECT_EQ(spf.source_spectrum.type, Spectrum_Type::FILE) << "SPF source spectrum type";
	EXPECT_EQ(spf.source_spectrum.values.size(), 61) << "SPF source spectrum wavelength count";
	std::pair<double, double> spf_source_expected_first_wavelength(0.28, 4.12e-11);
	std::pair<double, double> spf_source_expected_last_wavelength(0.4, 0.000101);
	EXPECT_TRUE(PAIR_NEAR(spf.source_spectrum.values[0], spf_source_expected_first_wavelength, 1e-14)) << "SPF source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(spf.source_spectrum.values[60], spf_source_expected_last_wavelength, 1e-14)) << "SPF source spectrum last point";
	EXPECT_EQ(spf.detector_spectrum.type, Spectrum_Type::FILE) << "SPF detector spectrum type";
	EXPECT_EQ(spf.detector_spectrum.values.size(), 61) << "SPF detector spectrum wavelength count";
	std::pair<double, double> spf_detector_expected_first_nonzero_wavelength(0.28, 1.00);
	std::pair<double, double> spf_detector_expected_last_nonzero_wavelength(0.4, 0.000122);
	EXPECT_TRUE(PAIR_NEAR(spf.detector_spectrum.values[0], spf_detector_expected_first_nonzero_wavelength, 1e-14)) << "SPF detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(spf.detector_spectrum.values[60], spf_detector_expected_last_nonzero_wavelength, 1e-14)) << "SPF detector spectrum last nonzero point";
	EXPECT_EQ(spf.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "SPF wavelength set type";
	EXPECT_EQ(spf.wavelength_set.values.size(), 0) << "SPF wavelength set wavelength count";
	EXPECT_EQ(spf.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "SPF integration rule type";
	EXPECT_EQ(spf.integration_rule.k, 1.0) << "SPF integration rule k";
	EXPECT_EQ(spf.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "SPF minimum wavelength type";
	EXPECT_EQ(spf.min_wavelength.value, 0.28) << "SPF minimum wavelength value";
	EXPECT_EQ(spf.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "SPF maximum wavelength type";
	EXPECT_EQ(spf.max_wavelength.value, 0.4) << "SPF maximum wavelength value";

	EXPECT_EQ(tdw.name, "TDW") << "TDW method type";
	EXPECT_EQ(tdw.source_spectrum.type, Spectrum_Type::FILE) << "TDW source spectrum type";
	EXPECT_EQ(tdw.source_spectrum.values.size(), 121) << "TDW source spectrum wavelength count";
	std::pair<double, double> tdw_source_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> tdw_source_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(tdw.source_spectrum.values[0], tdw_source_expected_first_wavelength, 1e-14)) << "TDW source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tdw.source_spectrum.values[120], tdw_source_expected_last_wavelength, 1e-14)) << "TDW source spectrum last point";
	EXPECT_EQ(tdw.detector_spectrum.type, Spectrum_Type::UV_ACTION) << "TDW detector spectrum type";
	EXPECT_EQ(tdw.detector_spectrum.values.size(), 0) << "TDW detector spectrum wavelength count";
	EXPECT_EQ(tdw.detector_spectrum.a, 3.6) << "TDW detector spectrum a";
	EXPECT_EQ(tdw.detector_spectrum.b, 12) << "TDW detector spectrum b";
	EXPECT_EQ(tdw.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "TDW wavelength set type";
	EXPECT_EQ(tdw.wavelength_set.values.size(), 0) << "TDW wavelength set wavelength count";
	EXPECT_EQ(tdw.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "TDW integration rule type";
	EXPECT_EQ(tdw.integration_rule.k, 1.0) << "TDW integration rule k";
	EXPECT_EQ(tdw.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TDW minimum wavelength type";
	EXPECT_EQ(tdw.min_wavelength.value, 0.3) << "TDW minimum wavelength value";
	EXPECT_EQ(tdw.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TDW maximum wavelength type";
	EXPECT_EQ(tdw.max_wavelength.value, 0.7) << "TDW maximum wavelength value";

	EXPECT_EQ(tkr.name, "TKR") << "TKR method type";
	EXPECT_EQ(tkr.source_spectrum.type, Spectrum_Type::FILE) << "TKR source spectrum type";
	EXPECT_EQ(tkr.source_spectrum.values.size(), 121) << "TKR source spectrum wavelength count";
	std::pair<double, double> tkr_source_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> tkr_source_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(tkr.source_spectrum.values[0], tkr_source_expected_first_wavelength, 1e-14)) << "TKR source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tkr.source_spectrum.values[120], tkr_source_expected_last_wavelength, 1e-14)) << "TKR source spectrum last point";
	EXPECT_EQ(tkr.detector_spectrum.type, Spectrum_Type::KROCHMANN) << "TKR detector spectrum type";
	EXPECT_EQ(tkr.detector_spectrum.values.size(), 0) << "TKR detector spectrum wavelength count";
	EXPECT_EQ(tkr.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "TKR wavelength set type";
	EXPECT_EQ(tkr.wavelength_set.values.size(), 0) << "TKR wavelength set wavelength count";
	EXPECT_EQ(tkr.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "TKR integration rule type";
	EXPECT_EQ(tkr.integration_rule.k, 1.0) << "TKR integration rule k";
	EXPECT_EQ(tkr.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TKR minimum wavelength type";
	EXPECT_EQ(tkr.min_wavelength.value, 0.3) << "TKR minimum wavelength value";
	EXPECT_EQ(tkr.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TKR maximum wavelength type";
	EXPECT_EQ(tkr.max_wavelength.value, 0.5) << "TKR maximum wavelength value";
}